

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O2

int __thiscall Qclass::detAction(Qclass *this,int state)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  iVar2 = rand();
  if (iVar2 % 100 < 0x51) {
    uVar3 = (long)state * 0x20;
    dVar5 = -10000.0;
    for (uVar4 = 0; iVar2 = (int)uVar3, uVar4 != 4; uVar4 = uVar4 + 1) {
      dVar1 = this->Q[state][uVar4];
      if (dVar5 <= dVar1) {
        uVar3 = uVar4;
      }
      uVar3 = uVar3 & 0xffffffff;
      dVar5 = (double)(-(ulong)(dVar1 < dVar5) & (ulong)dVar5 |
                      ~-(ulong)(dVar1 < dVar5) & (ulong)dVar1);
    }
  }
  else {
    iVar2 = rand();
    iVar2 = iVar2 % 4;
  }
  return iVar2;
}

Assistant:

int Qclass::detAction(int state) {
  int action;
  int chosenAction;
  int temp = rand() % 100;
  if (temp > 80) {   // Randomly explores for an action 20% of the time
    int randAction = rand() % 4;
    chosenAction = randAction;
  } else {
    double maxQ = -10000;
    for (int i = 0; i < 4; i++) {
      if (Q[state][i] >= maxQ) {
        maxQ = Q[state][i];
        chosenAction = i;
      }
    }
  }
  action = chosenAction;
  return action;
}